

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O1

void * zexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  ulong uVar1;
  undefined8 *puVar2;
  int iVar3;
  ExpHeader *pEVar4;
  char *src;
  void *old;
  undefined8 uVar5;
  int iVar6;
  int_t *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  MemType MVar13;
  int iVar14;
  doublecomplex *dnew;
  float fVar15;
  float local_3c;
  
  pEVar4 = Glu->expanders;
  iVar6 = *prev_len;
  iVar9 = (int)((float)iVar6 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar9 = iVar6;
  }
  if (keep_prev != 0) {
    iVar9 = iVar6;
  }
  MVar13 = type & ~UCOL;
  if (Glu->MemModel == SYSTEM) {
    pvVar12 = superlu_malloc((long)iVar9 << (MVar13 != LSUB) * '\x02' + 2);
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        if (pvVar12 == (void *)0x0) {
          local_3c = 1.5;
          iVar6 = 0xb;
          do {
            iVar6 = iVar6 + -1;
            if (iVar6 == 0) {
              return (void *)0x0;
            }
            local_3c = (local_3c + 1.0) * 0.5;
            iVar9 = (int)((float)*prev_len * local_3c);
            pvVar12 = superlu_malloc((long)iVar9 << (MVar13 != LSUB) * '\x02' + 2);
          } while (pvVar12 == (void *)0x0);
        }
      }
      else if (pvVar12 == (void *)0x0) {
        return (void *)0x0;
      }
      old = pEVar4[type].mem;
      if (MVar13 == LSUB) {
        copy_mem_int(len_to_copy,old,pvVar12);
      }
      else if (0 < len_to_copy) {
        lVar11 = 0;
        do {
          puVar2 = (undefined8 *)((long)old + lVar11);
          uVar5 = puVar2[1];
          *(undefined8 *)((long)pvVar12 + lVar11) = *puVar2;
          ((undefined8 *)((long)pvVar12 + lVar11))[1] = uVar5;
          lVar11 = lVar11 + 0x10;
        } while ((ulong)(uint)len_to_copy << 4 != lVar11);
      }
      superlu_free(pEVar4[type].mem);
    }
    pEVar4[type].mem = pvVar12;
  }
  else if (Glu->num_expansions == 0) {
    iVar8 = iVar9 << (MVar13 != LSUB) * '\x02' + 2;
    iVar6 = (Glu->stack).used + iVar8;
    if (iVar6 < (Glu->stack).size) {
      iVar14 = (Glu->stack).top1;
      pvVar12 = (void *)((long)iVar14 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar8 + iVar14;
      (Glu->stack).used = iVar6;
    }
    else {
      pvVar12 = (void *)0x0;
    }
    if ((type < LSUB) && (iVar6 = (int)pvVar12, ((ulong)pvVar12 & 7) != 0)) {
      uVar1 = (long)pvVar12 + 7;
      pvVar12 = (void *)(uVar1 & 0xfffffffffffffff8);
      iVar6 = ((uint)uVar1 & 0xfffffff8) - iVar6;
      piVar7 = &(Glu->stack).top1;
      *piVar7 = *piVar7 + iVar6;
      piVar7 = &(Glu->stack).used;
      *piVar7 = *piVar7 + iVar6;
    }
    pEVar4[type].mem = pvVar12;
  }
  else {
    iVar6 = *prev_len;
    iVar14 = iVar9 - iVar6 << (MVar13 != LSUB) * '\x02' + 2;
    iVar8 = (Glu->stack).used;
    if (keep_prev == 0) {
      iVar3 = (Glu->stack).size;
      if (iVar3 <= iVar8 + iVar14) {
        fVar15 = 1.5;
        iVar10 = 0xb;
        do {
          iVar10 = iVar10 + -1;
          if (iVar10 == 0) {
            return (void *)0x0;
          }
          fVar15 = (fVar15 + 1.0) * 0.5;
          iVar9 = (int)(fVar15 * (float)iVar6);
          iVar14 = iVar9 - iVar6 << (MVar13 != LSUB) * '\x02' + 2;
        } while (iVar3 <= iVar8 + iVar14);
      }
    }
    else if ((Glu->stack).size <= iVar8 + iVar14) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar4[type + UCOL].mem;
      lVar11 = (long)iVar14;
      user_bcopy(src,src + lVar11,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar7 = (int_t *)((long)pEVar4[3].mem + lVar11);
        pEVar4[3].mem = piVar7;
        Glu->usub = piVar7;
      }
      if (type < LSUB) {
        piVar7 = (int_t *)((long)pEVar4[2].mem + lVar11);
        pEVar4[2].mem = piVar7;
        Glu->lsub = piVar7;
      }
      if (type == LUSUP) {
        pvVar12 = (void *)(lVar11 + (long)pEVar4[1].mem);
        pEVar4[1].mem = pvVar12;
        Glu->ucol = pvVar12;
      }
      iVar6 = (Glu->stack).top1 + iVar14;
      (Glu->stack).top1 = iVar6;
      iVar8 = (Glu->stack).used + iVar14;
      (Glu->stack).used = iVar8;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar6 + iVar14;
        (Glu->stack).used = iVar8 + iVar14;
      }
    }
  }
  pEVar4[type].size = iVar9;
  *prev_len = iVar9;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar4[type].mem;
}

Assistant:

void
*zexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(doublecomplex);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_doublecomplex(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = zuser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}